

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapeTriang>::ComputeMasterDirections(TPZShapeData *data)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  long lVar10;
  int side;
  long lVar11;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  TPZFMatrix<double>::Resize(&(data->fMasterDirections).super_TPZFMatrix<double>,3,0xe);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  lVar11 = 0;
  bVar4 = true;
  do {
    bVar9 = bVar4;
    if ((local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar11) ||
       (local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar11)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_110.fElem[local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar11 + lVar11] =
         1.0;
    lVar11 = 1;
    bVar4 = false;
  } while (bVar9);
  pztopology::TPZTriangle::ComputeHDivDirections<double>
            (&local_110,&(data->fMasterDirections).super_TPZFMatrix<double>);
  iVar6 = 0;
  lVar11 = 3;
  do {
    uVar5 = pztopology::TPZTriangle::NContainedSides((int)lVar11);
    if (0 < (int)uVar5) {
      lVar2 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow;
      uVar8 = 0;
      do {
        lVar1 = uVar8 + (long)iVar6;
        lVar10 = 0;
        bVar4 = true;
        do {
          bVar9 = bVar4;
          if (((lVar2 <= lVar10) || (lVar1 < 0)) ||
             ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol <= lVar1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar7 = lVar2 * lVar1;
          pdVar3 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
          pdVar3[lVar7 + lVar10] =
               (double)(data->fSideOrient).super_TPZVec<int>.fStore[lVar11 + -3] *
               pdVar3[lVar7 + lVar10];
          lVar10 = 1;
          bVar4 = false;
        } while (bVar9);
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar5);
    }
    iVar6 = iVar6 + uVar5;
    lVar11 = lVar11 + 1;
    if (lVar11 == 6) {
      TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_01816200);
      return;
    }
  } while( true );
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeMasterDirections(TPZShapeData &data)
{
    int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    data.fMasterDirections.Resize(3,numvec);
    TPZFNMatrix<9,REAL> gradx(3,TSHAPE::Dimension,0.);
    for (int i = 0; i < TSHAPE::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TSHAPE::ComputeHDivDirections(gradx, data.fMasterDirections);
    
    int firstface = TSHAPE::NSides - TSHAPE::NFacets - 1;
    int lastface = TSHAPE::NSides - 1;
    int cont = 0;
    for(int side = firstface; side < lastface; side++)
    {
        int nvec = TSHAPE::NContainedSides(side);
        for (int ivet = 0; ivet<nvec; ivet++)
        {
            for (int il = 0; il<dim; il++)
            {
              data.fMasterDirections(il,ivet+cont) *= data.fSideOrient[side-firstface];
            }
        }
        cont += nvec;
    }
    
}